

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_bools
          (TensorValue *this,TensorValue_RepeatedBools *bools)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TensorValue_RepeatedBools *bools_local;
  TensorValue *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_value(this);
  if (bools != (TensorValue_RepeatedBools *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>::GetOwningArena
                   (bools);
    message_arena = (Arena *)bools;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>
                              (message_arena_00,bools,submessage_arena_00);
    }
    set_has_bools(this);
    (this->value_).floats_ = (TensorValue_RepeatedFloats *)message_arena;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_bools(::CoreML::Specification::MILSpec::TensorValue_RepeatedBools* bools) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (bools) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedBools>::GetOwningArena(bools);
    if (message_arena != submessage_arena) {
      bools = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, bools, submessage_arena);
    }
    set_has_bools();
    value_.bools_ = bools;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.bools)
}